

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datagram_socket.cpp
# Opt level: O1

int __thiscall sockpp::datagram_socket::open(datagram_socket *this,char *__file,int __oflag,...)

{
  ushort uVar1;
  int s;
  undefined8 uVar2;
  result<int> createRes;
  result<int> local_48;
  undefined1 local_30 [24];
  
  uVar1 = (**(code **)(*(long *)___oflag + 0x28))(___oflag);
  s = ::socket((uint)uVar1,2,0);
  socket::check_socket(&local_48,s);
  if (local_48.err_._M_value == 0) {
    socket::reset((socket *)__file,local_48.val_);
    socket::bind((socket *)this,(int)__file,___oflag,0);
    if (*(int *)(this + 8) == 0) {
      *(undefined4 *)(this + 8) = 0;
      uVar2 = std::_V2::system_category();
      *(undefined8 *)(this + 0x10) = uVar2;
    }
    else {
      (**(code **)(*(long *)__file + 0x28))(local_30,__file);
    }
  }
  else {
    *(ulong *)(this + 8) = CONCAT44(local_48.err_._4_4_,local_48.err_._M_value);
    *(error_category **)(this + 0x10) = local_48.err_._M_cat;
  }
  return (int)this;
}

Assistant:

result<> datagram_socket::open(const sock_address& addr) noexcept {
    auto domain = addr.family();
    if (auto createRes = create_handle(domain); !createRes) {
        return createRes.error();
    }
    else {
        reset(createRes.value());
        if (auto res = bind(addr); !res) {
            close();
            return res;
        }
    }
    return none{};
}